

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# event.c
# Opt level: O0

void evthread_notify_drain_eventfd(int fd,short what,void *arg)

{
  ssize_t sVar1;
  int *piVar2;
  event_base *base;
  ssize_t r;
  uint64_t msg;
  void *arg_local;
  short what_local;
  int fd_local;
  
  msg = (uint64_t)arg;
  arg_local._2_2_ = what;
  arg_local._4_4_ = fd;
  sVar1 = read(fd,&r,8);
  if (sVar1 < 0) {
    piVar2 = __errno_location();
    if (*piVar2 != 0xb) {
      event_sock_warn(arg_local._4_4_,"Error reading from eventfd");
    }
  }
  if (*(long *)((long)arg + 0x1b0) != 0) {
    (*evthread_lock_fns_.lock)(0,*(void **)((long)arg + 0x1b0));
  }
  *(undefined4 *)((long)arg + 0x1f0) = 0;
  if (*(long *)((long)arg + 0x1b0) != 0) {
    (*evthread_lock_fns_.unlock)(0,*(void **)((long)arg + 0x1b0));
  }
  return;
}

Assistant:

static void
evthread_notify_drain_eventfd(evutil_socket_t fd, short what, void *arg)
{
	ev_uint64_t msg;
	ev_ssize_t r;
	struct event_base *base = arg;

	r = read(fd, (void*) &msg, sizeof(msg));
	if (r<0 && errno != EAGAIN) {
		event_sock_warn(fd, "Error reading from eventfd");
	}
	EVBASE_ACQUIRE_LOCK(base, th_base_lock);
	base->is_notify_pending = 0;
	EVBASE_RELEASE_LOCK(base, th_base_lock);
}